

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O3

bool __thiscall GT7VolumeFile::parseHeader(GT7VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  size_type *psVar1;
  pointer puVar2;
  pointer pSVar3;
  pointer pcVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  VolumeFile *pVVar10;
  uint64_t uVar11;
  uint32_t seed;
  VolumeFile *this_00;
  GT7VolumeFile *pGVar12;
  GT7VolumeFile *this_01;
  uint uVar13;
  pointer __s;
  uint uVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  path p;
  allocator<char> local_99;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  long *local_80 [2];
  long local_70 [2];
  pointer local_60;
  vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->super_VolumeFile).m_swapEndian == true) {
    if (*(int *)header != 0x6251745b) {
      return false;
    }
    seed = swap_bytes(*(undefined4 *)(header + 0xf0));
    uVar13 = swap_bytes(*(undefined4 *)(header + 0xf4));
    uVar14 = swap_bytes(*(undefined4 *)(header + 0xf8));
    uVar9 = swap_bytes(*(undefined4 *)(header + 0xfc));
  }
  else {
    if (*(int *)header != 0x5b745162) {
      return false;
    }
    seed = *(uint32_t *)(header + 0xf0);
    uVar13 = *(uint *)(header + 0xf4);
    uVar14 = *(uint *)(header + 0xf8);
    uVar9 = *(uint *)(header + 0xfc);
  }
  std::vector<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>::resize
            (&this->m_volumes,(ulong)uVar9);
  pVVar10 = (VolumeFile *)
            (this->m_volumes).
            super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (VolumeFile *)
            (this->m_volumes).
            super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)pVVar10 - (long)this_00 != 0) {
    memmove(this_00,header + 0x100,(long)pVVar10 - (long)this_00);
    this_00 = (VolumeFile *)
              (this->m_volumes).
              super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar10 = (VolumeFile *)
              (this->m_volumes).
              super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; this_00 != pVVar10; this_00 = (VolumeFile *)&(this_00->m_origPath).m_pathname.field_2) {
    psVar1 = &(this_00->m_origPath).m_pathname._M_string_length;
    *psVar1 = *psVar1 << 0x20 | *psVar1 >> 0x20;
  }
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VolumeFile::readDataAt
            (this_00,&(this->super_VolumeFile).m_mainStream,&local_98,0x800,(ulong)uVar13);
  pGVar12 = this;
  VolumeFile::decryptData
            (&this->super_VolumeFile,
             local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,seed);
  bVar7 = VolumeFile::inflateDataIfNeeded(&pGVar12->super_VolumeFile,&local_98,(ulong)uVar14);
  if (bVar7) {
    (this->super_VolumeFile).m_dataOffset = 0;
    puVar2 = (this->super_VolumeFile).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->super_VolumeFile).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = (this->super_VolumeFile).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->super_VolumeFile).m_data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->super_VolumeFile).m_data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->super_VolumeFile).m_data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_60 = (this->m_volumes).
               super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    __s = (this->m_volumes).
          super__Vector_base<GT7VolumeFile::VolumeInfo,_std::allocator<GT7VolumeFile::VolumeInfo>_>.
          _M_impl.super__Vector_impl_data._M_start;
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
    local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6;
    if (__s == local_60) {
      bVar7 = true;
    }
    else {
      local_58 = &(this->super_VolumeFile).m_dataStreams;
      do {
        std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::emplace_back<>
                  (local_58);
        pSVar3 = (this->super_VolumeFile).m_dataStreams.
                 super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,__s->fileName,&local_99);
        pcVar4 = (this->super_VolumeFile).m_basePath.m_pathname._M_dataplus._M_p;
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,pcVar4,
                   pcVar4 + (this->super_VolumeFile).m_basePath.m_pathname._M_string_length);
        boost::filesystem::path::operator/=((path *)local_80,(path *)local_50);
        std::__cxx11::string::_M_assign((string *)&pSVar3[-1].filePath);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pGVar12 = (GT7VolumeFile *)(pSVar3 + -1);
        std::ifstream::open((string *)pGVar12,(_Ios_Openmode)&pSVar3[-1].filePath);
        cVar8 = std::__basic_file<char>::is_open();
        if (cVar8 == '\0') {
LAB_0011d543:
          bVar7 = false;
          goto LAB_0011d551;
        }
        std::istream::seekg((long)pGVar12,_S_beg);
        uVar11 = std::istream::tellg();
        pSVar3[-1].fileSize = uVar11;
        this_01 = pGVar12;
        std::istream::seekg((long)pGVar12,_S_beg);
        bVar7 = parseExtendedHeader(this_01,(StreamDesc *)pGVar12);
        if (!bVar7) goto LAB_0011d543;
        __s = __s + 1;
      } while (__s != local_60);
      bVar7 = true;
    }
  }
  else {
    bVar7 = false;
  }
LAB_0011d551:
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool GT7VolumeFile::parseHeader(const uint8_t* header, uint64_t headerSize)
{
	const auto* p = header;

	const auto headerSizeAligned = SEGMENT_SIZE;

	const auto magic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (magic != HEADER_MAGIC) {
		return false;
	}

	// TODO: figure out what are these fields
	const auto hdr_0x1CC = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x04
	const auto hdr_0x1D0 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x08
	const auto hdr_0x1D4 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x0C
	const auto hdr_0x1D8 = VOLUME_READ_NEXT_SELF(p, uint32_t); // 0x10

	advancePointerInplace(p, 0xDC);

	const auto seed = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto zDataSize = VOLUME_READ_NEXT_SELF(p, uint32_t); // with header
	const auto dataSize = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto volumeCount = VOLUME_READ_NEXT_SELF(p, uint32_t);

	m_volumes.resize(volumeCount);
	std::copy_n(reinterpret_cast<const VolumeInfo*>(p), m_volumes.size(), m_volumes.begin());
	for (auto& volumeInfo: m_volumes) {
		volumeInfo.fileSize = (volumeInfo.fileSize >> 32) | ((volumeInfo.fileSize & 0xFFFFFFFF) << 32);
	}

	std::vector<uint8_t> data;
	if (!readDataAt(data, headerSizeAligned, zDataSize)) {
		return false;
	}
	decryptData(data.data(), data.size(), seed);
	if (!inflateDataIfNeeded(data, dataSize)) {
		return false;
	}

	m_dataOffset = 0;
	m_data.swap(data);

	for (auto& volumeInfo: m_volumes) {
		m_dataStreams.emplace_back();
		auto& streamDesc = m_dataStreams.back();
		{
			streamDesc.filePath = (m_basePath / volumeInfo.fileName).string();
			if (!prepareStream(streamDesc.stream, streamDesc.filePath, &streamDesc.fileSize)) {
				return false;
			}
			if (!parseExtendedHeader(streamDesc)) {
				return false;
			}
		}
	}

	return true;
}